

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LexerFacts.cpp
# Opt level: O0

KeywordVersion slang::parsing::LexerFacts::getDefaultKeywordVersion(LanguageVersion languageVersion)

{
  LanguageVersion languageVersion_local;
  undefined1 local_1;
  
  if (languageVersion == Default) {
    local_1 = v1800_2017;
  }
  else {
    local_1 = v1800_2023;
  }
  return local_1;
}

Assistant:

KeywordVersion LexerFacts::getDefaultKeywordVersion(LanguageVersion languageVersion) {
    switch (languageVersion) {
        case LanguageVersion::v1800_2017:
            return KeywordVersion::v1800_2017;
        case LanguageVersion::v1800_2023:
            return KeywordVersion::v1800_2023;
    }
    SLANG_UNREACHABLE;
}